

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<long,long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,long *args,long *args_1)

{
  ostringstream oss;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  format<long,long>((ostream *)local_1a0,(char *)this,(long *)fmt,args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}